

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

cTValue * lj_tab_get(lua_State *L,GCtab *t,cTValue *key)

{
  double dVar1;
  uint key_00;
  int iVar2;
  cTValue *pcVar3;
  cTValue *local_58;
  cTValue *local_50;
  Node *n;
  cTValue *tv_1;
  int32_t k;
  lua_Number nk;
  cTValue *tv;
  cTValue *key_local;
  GCtab *t_local;
  lua_State *L_local;
  
  if ((int)(key->field_4).it >> 0xf == -5) {
    pcVar3 = lj_tab_getstr(t,(GCstr *)(key->u64 & 0x7fffffffffff));
    if (pcVar3 != (cTValue *)0x0) {
      return pcVar3;
    }
  }
  else {
    if ((uint)((int)(key->field_4).it >> 0xf) < 0xfffffff2) {
      dVar1 = key->n;
      key_00 = (uint)dVar1;
      if ((dVar1 == (double)(int)key_00) && (!NAN(dVar1) && !NAN((double)(int)key_00))) {
        if (key_00 < t->asize) {
          local_58 = (cTValue *)((t->array).ptr64 + (long)(int)key_00 * 8);
        }
        else {
          local_58 = lj_tab_getinth(t,key_00);
        }
        if (local_58 != (cTValue *)0x0) {
          return local_58;
        }
        goto LAB_0011640d;
      }
    }
    else if (key->u64 == 0xffffffffffffffff) goto LAB_0011640d;
    local_50 = &hashkey(t,key)->val;
    do {
      iVar2 = lj_obj_equal(local_50 + 1,key);
      if (iVar2 != 0) {
        return local_50;
      }
      local_50 = (cTValue *)local_50[2].gcr.gcptr64;
    } while (local_50 != (cTValue *)0x0);
  }
LAB_0011640d:
  return (cTValue *)((L->glref).ptr64 + 0xf8);
}

Assistant:

cTValue *lj_tab_get(lua_State *L, GCtab *t, cTValue *key)
{
  if (tvisstr(key)) {
    cTValue *tv = lj_tab_getstr(t, strV(key));
    if (tv)
      return tv;
  } else if (tvisint(key)) {
    cTValue *tv = lj_tab_getint(t, intV(key));
    if (tv)
      return tv;
  } else if (tvisnum(key)) {
    lua_Number nk = numV(key);
    int32_t k = lj_num2int(nk);
    if (nk == (lua_Number)k) {
      cTValue *tv = lj_tab_getint(t, k);
      if (tv)
	return tv;
    } else {
      goto genlookup;  /* Else use the generic lookup. */
    }
  } else if (!tvisnil(key)) {
    Node *n;
  genlookup:
    n = hashkey(t, key);
    do {
      if (lj_obj_equal(&n->key, key))
	return &n->val;
    } while ((n = nextnode(n)));
  }
  return niltv(L);
}